

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclUtil.c
# Opt level: O3

void Abc_SclSclGates2MioGates(SC_Lib *pLib,Abc_Ntk_t *p)

{
  int iVar1;
  int iVar2;
  long *plVar3;
  long lVar4;
  undefined8 *puVar5;
  Mio_Gate_t *pMVar6;
  Vec_Ptr_t *pVVar7;
  uint uVar8;
  Vec_Int_t *__ptr;
  uint uVar9;
  long lVar10;
  
  if (p->vGates == (Vec_Int_t *)0x0) {
    __assert_fail("p->vGates != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclUtil.c"
                  ,0x4b,"void Abc_SclSclGates2MioGates(SC_Lib *, Abc_Ntk_t *)");
  }
  pVVar7 = p->vObjs;
  if (0 < pVVar7->nSize) {
    lVar10 = 0;
    uVar8 = 0;
    uVar9 = 0;
    do {
      plVar3 = (long *)pVVar7->pArray[lVar10];
      if ((((plVar3 != (long *)0x0) && ((*(uint *)((long)plVar3 + 0x14) & 0xf) == 7)) &&
          (iVar1 = *(int *)((long)plVar3 + 0x1c), iVar1 != 0)) &&
         (((lVar4 = *plVar3, iVar1 != 1 || (*(int *)(lVar4 + 4) != 4)) || (plVar3[7] != 0)))) {
        iVar2 = (int)plVar3[2];
        if (((long)iVar2 < 0) || (*(int *)(*(long *)(lVar4 + 0x178) + 4) <= iVar2)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar2 = *(int *)(*(long *)(*(long *)(lVar4 + 0x178) + 8) + (long)iVar2 * 4);
        if (((long)iVar2 < 0) || (*(int *)(*(long *)(lVar4 + 0x170) + 100) <= iVar2)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        puVar5 = *(undefined8 **)(*(long *)(*(long *)(lVar4 + 0x170) + 0x68) + (long)iVar2 * 8);
        if (*(int *)(puVar5 + 8) != iVar1) {
          __assert_fail("pCell->n_inputs == Abc_ObjFaninNum(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclUtil.c"
                        ,0x4f,"void Abc_SclSclGates2MioGates(SC_Lib *, Abc_Ntk_t *)");
        }
        pMVar6 = Mio_LibraryReadGateByName((Mio_Library_t *)p->pManFunc,(char *)*puVar5,(char *)0x0)
        ;
        plVar3[7] = (long)pMVar6;
        if ((*(byte *)((long)plVar3 + 0x14) & 0x30) != 0) {
          __assert_fail("pObj->fMarkA == 0 && pObj->fMarkB == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclUtil.c"
                        ,0x52,"void Abc_SclSclGates2MioGates(SC_Lib *, Abc_Ntk_t *)");
        }
        uVar9 = uVar9 + (pMVar6 == (Mio_Gate_t *)0x0);
        uVar8 = uVar8 + 1;
        pVVar7 = p->vObjs;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < pVVar7->nSize);
    if (uVar9 != 0) {
      printf("Could not find %d (out of %d) gates in the current library.\n",(ulong)uVar9,
             (ulong)uVar8);
    }
  }
  __ptr = p->vGates;
  if (__ptr != (Vec_Int_t *)0x0) {
    if (__ptr->pArray != (int *)0x0) {
      free(__ptr->pArray);
      p->vGates->pArray = (int *)0x0;
      __ptr = p->vGates;
      if (__ptr == (Vec_Int_t *)0x0) goto LAB_00479ff3;
    }
    free(__ptr);
    p->vGates = (Vec_Int_t *)0x0;
  }
LAB_00479ff3:
  p->pSCLib = (void *)0x0;
  return;
}

Assistant:

void Abc_SclSclGates2MioGates( SC_Lib * pLib, Abc_Ntk_t * p )
{
    Abc_Obj_t * pObj;
    SC_Cell * pCell;
    int i, Counter = 0, CounterAll = 0;
    assert( p->vGates != NULL );
    Abc_NtkForEachNodeNotBarBuf1( p, pObj, i )
    {
        pCell = Abc_SclObjCell(pObj);
        assert( pCell->n_inputs == Abc_ObjFaninNum(pObj) );
        pObj->pData = Mio_LibraryReadGateByName( (Mio_Library_t *)p->pManFunc, pCell->pName, NULL );
        Counter += (pObj->pData == NULL);
        assert( pObj->fMarkA == 0 && pObj->fMarkB == 0 );
        CounterAll++;
    }
    if ( Counter )
        printf( "Could not find %d (out of %d) gates in the current library.\n", Counter, CounterAll );
    Vec_IntFreeP( &p->vGates );
    p->pSCLib = NULL;
}